

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_PlaneSurface::SetDomain(ON_PlaneSurface *this,int dir,double t0,double t1)

{
  if (t0 < t1 && (uint)dir < 2) {
    ON_Interval::Set((ON_Interval *)(&this->field_0x90 + (ulong)(uint)dir * 0x10),t0,t1);
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  }
  return t0 < t1 && (uint)dir < 2;
}

Assistant:

bool ON_PlaneSurface::SetDomain( 
  int dir, 
  double t0, 
  double t1
  )
{
  bool rc = false;
  if ( dir >= 0 && dir <= 1 && t0 < t1 )
  {
    rc = true;
    m_domain[dir].Set(t0,t1);
    DestroySurfaceTree();
  }
  return rc;
}